

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O0

optional<pbrt::SquareMatrix<2>_> * __thiscall
pstd::optional<pbrt::SquareMatrix<2>_>::operator=
          (optional<pbrt::SquareMatrix<2>_> *this,optional<pbrt::SquareMatrix<2>_> *v)

{
  bool bVar1;
  optional<pbrt::SquareMatrix<2>_> *this_00;
  SquareMatrix<2> *pSVar2;
  optional<pbrt::SquareMatrix<2>_> *in_RSI;
  optional<pbrt::SquareMatrix<2>_> *in_RDI;
  optional<pbrt::SquareMatrix<2>_> *in_stack_ffffffffffffffe0;
  
  reset(in_stack_ffffffffffffffe0);
  bVar1 = has_value(in_RSI);
  if (bVar1) {
    this_00 = (optional<pbrt::SquareMatrix<2>_> *)ptr((optional<pbrt::SquareMatrix<2>_> *)0x600a97);
    pSVar2 = value(this_00);
    *(Float (*) [2])&this_00->optionalValue = pSVar2->m[0];
    *(Float (*) [2])((long)&this_00->optionalValue + 8) = pSVar2->m[1];
    in_RDI->set = true;
    reset(this_00);
  }
  return in_RDI;
}

Assistant:

PBRT_CPU_GPU
    optional &operator=(optional &&v) {
        reset();
        if (v.has_value()) {
            new (ptr()) T(std::move(v.value()));
            set = true;
            v.reset();
        }
        return *this;
    }